

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O0

void compact_upto_last_wal_flush_bid_check(void)

{
  uint64_t num_markers;
  fdb_snapshot_info_t *markers_out;
  char valuebuf [512];
  char keybuf [256];
  fdb_status s;
  fdb_kvs_config kvs_config;
  fdb_config config;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int ncommit;
  int ndocs;
  int r;
  int j;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  uint64_t *in_stack_00000b98;
  fdb_snapshot_info_t **in_stack_00000ba0;
  fdb_file_handle *in_stack_00000ba8;
  fdb_file_handle *in_stack_fffffffffffffa38;
  fdb_file_handle *in_stack_fffffffffffffa40;
  fdb_snapshot_info_t *in_stack_fffffffffffffa48;
  size_t in_stack_fffffffffffffa58;
  void *in_stack_fffffffffffffa60;
  size_t in_stack_fffffffffffffa68;
  void *in_stack_fffffffffffffa70;
  fdb_kvs_handle *in_stack_fffffffffffffa78;
  char local_498 [120];
  fdb_kvs_config *in_stack_fffffffffffffbe0;
  char *in_stack_fffffffffffffbe8;
  fdb_kvs_handle **in_stack_fffffffffffffbf0;
  fdb_file_handle *in_stack_fffffffffffffbf8;
  fdb_config *in_stack_fffffffffffffc58;
  char *in_stack_fffffffffffffc60;
  fdb_file_handle **in_stack_fffffffffffffc68;
  fdb_file_handle local_298 [6];
  fdb_status local_18c;
  undefined1 local_170 [208];
  undefined8 local_a0;
  fdb_file_handle *local_78;
  int local_64;
  int local_60;
  int local_5c;
  uint local_58;
  uint local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  local_60 = 1000;
  local_64 = 0x14;
  memleak_start();
  local_5c = system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  memcpy(local_170,&stack0xfffffffffffffa70,0xf8);
  local_a0 = 0x14;
  fdb_get_default_kvs_config();
  local_18c = fdb_open(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,in_stack_fffffffffffffc58
                      );
  if (local_18c != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xdc5);
    compact_upto_last_wal_flush_bid_check::__test_pass = 0;
    if (local_18c != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xdc5,"void compact_upto_last_wal_flush_bid_check()");
    }
  }
  local_18c = fdb_kvs_open(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
                           in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  if (local_18c != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xdc8);
    compact_upto_last_wal_flush_bid_check::__test_pass = 0;
    if (local_18c != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xdc8,"void compact_upto_last_wal_flush_bid_check()");
    }
  }
  memset(local_498,0x78,200);
  local_54 = 0;
  do {
    if (local_64 <= (int)local_54) {
      local_18c = fdb_get_all_snap_markers(in_stack_00000ba8,in_stack_00000ba0,in_stack_00000b98);
      if (local_18c != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xdda);
        compact_upto_last_wal_flush_bid_check::__test_pass = 0;
        if (local_18c != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xdda,"void compact_upto_last_wal_flush_bid_check()");
        }
      }
      local_18c = fdb_compact_upto(in_stack_fffffffffffffa40,(char *)in_stack_fffffffffffffa38,
                                   0x1183b8);
      if (local_18c != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xdde);
        compact_upto_last_wal_flush_bid_check::__test_pass = 0;
        if (local_18c != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xdde,"void compact_upto_last_wal_flush_bid_check()");
        }
      }
      local_18c = fdb_free_snap_markers
                            (in_stack_fffffffffffffa48,(uint64_t)in_stack_fffffffffffffa40);
      local_18c = fdb_get_all_snap_markers(in_stack_00000ba8,in_stack_00000ba0,in_stack_00000b98);
      if (local_18c != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xde3);
        compact_upto_last_wal_flush_bid_check::__test_pass = 0;
        if (local_18c != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xde3,"void compact_upto_last_wal_flush_bid_check()");
        }
      }
      local_18c = fdb_compact_upto(in_stack_fffffffffffffa40,(char *)in_stack_fffffffffffffa38,
                                   0x1184dd);
      if (local_18c != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xde8);
        compact_upto_last_wal_flush_bid_check::__test_pass = 0;
        if (local_18c != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xde8,"void compact_upto_last_wal_flush_bid_check()");
        }
      }
      local_18c = fdb_free_snap_markers
                            (in_stack_fffffffffffffa48,(uint64_t)in_stack_fffffffffffffa40);
      local_18c = fdb_close(in_stack_fffffffffffffa38);
      if (local_18c != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xded);
        compact_upto_last_wal_flush_bid_check::__test_pass = 0;
        if (local_18c != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xded,"void compact_upto_last_wal_flush_bid_check()");
        }
      }
      local_18c = fdb_shutdown();
      memleak_end();
      if (compact_upto_last_wal_flush_bid_check::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","compact upto last WAL flush bid check test");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","compact upto last WAL flush bid check test");
      }
      return;
    }
    for (local_58 = 0; (int)local_58 < local_60; local_58 = local_58 + 1) {
      sprintf((char *)local_298,"k%06d",(ulong)local_58);
      sprintf(local_498,"v%d_%04d",(ulong)local_54,(ulong)local_58);
      in_stack_fffffffffffffa40 = local_298;
      in_stack_fffffffffffffa38 = local_78;
      strlen((char *)local_298);
      local_18c = fdb_set_kv(in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,
                             in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,
                             in_stack_fffffffffffffa58);
      if (local_18c != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xdd0);
        compact_upto_last_wal_flush_bid_check::__test_pass = 0;
        if (local_18c != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xdd0,"void compact_upto_last_wal_flush_bid_check()");
        }
      }
    }
    local_18c = fdb_commit(in_stack_fffffffffffffa38,'\0');
    if (local_18c != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xdd3);
      compact_upto_last_wal_flush_bid_check::__test_pass = 0;
      if (local_18c != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0xdd3,"void compact_upto_last_wal_flush_bid_check()");
      }
    }
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

void compact_upto_last_wal_flush_bid_check()
{
    TEST_INIT();
    int i, j;
    int r;
    int ndocs=1000;
    int ncommit=20;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_status s; (void)s;
    char keybuf[256], valuebuf[512];

    memleak_start();

    // remove previous dummy files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    config = fdb_get_default_config();
    config.num_keeping_headers = 20;
    kvs_config = fdb_get_default_kvs_config();

    // create a file
    s = fdb_open(&dbfile, "compact_test", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    memset(valuebuf, 'x', 200);
    for (i=0; i<ncommit; ++i) {
        for (j=0; j<ndocs; ++j) {
            sprintf(keybuf, "k%06d", j);
            sprintf(valuebuf, "v%d_%04d", i, j);
            s = fdb_set_kv(db, keybuf, strlen(keybuf)+1, valuebuf, 200);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
        }
        s = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    fdb_snapshot_info_t *markers_out;
    uint64_t num_markers;

    s = fdb_get_all_snap_markers(dbfile, &markers_out, &num_markers);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // compact_upto() will copy DB headers to be kept
    s = fdb_compact_upto(dbfile, "compact_test2", markers_out[15].marker);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_free_snap_markers(markers_out, num_markers);

    s = fdb_get_all_snap_markers(dbfile, &markers_out, &num_markers);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // call compact_upto() again
    // copying the previous DB headers should be done correctly.
    s = fdb_compact_upto(dbfile, "compact_test3", markers_out[15].marker);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_free_snap_markers(markers_out, num_markers);

    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_shutdown();
    memleak_end();

    TEST_RESULT("compact upto last WAL flush bid check test");
}